

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::IsWorthSpecializingToInt32Branch(GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val)

{
  bool bVar1;
  RegOpnd *pRVar2;
  bool bVar3;
  
  bVar1 = ValueInfo::HasIntConstantValue(src1Val->valueInfo,false);
  bVar3 = true;
  if (!bVar1) {
    bVar1 = IR::Opnd::IsRegOpnd(instr->m_src1);
    if (bVar1) {
      pRVar2 = IR::Opnd::AsRegOpnd(instr->m_src1);
      bVar1 = GlobOptBlockData::IsInt32TypeSpecialized
                        (&this->currentBlock->globOptData,&pRVar2->m_sym->super_Sym);
      if (!bVar1) {
        bVar1 = ValueInfo::HasIntConstantValue(src2Val->valueInfo,false);
        if (!bVar1) {
          bVar1 = IR::Opnd::IsRegOpnd(instr->m_src2);
          if (bVar1) {
            pRVar2 = IR::Opnd::AsRegOpnd(instr->m_src2);
            bVar1 = GlobOptBlockData::IsInt32TypeSpecialized
                              (&this->currentBlock->globOptData,&pRVar2->m_sym->super_Sym);
            if (!bVar1) {
              bVar3 = false;
            }
          }
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool
GlobOpt::IsWorthSpecializingToInt32Branch(IR::Instr const * instr, Value const * src1Val, Value const * src2Val) const
{
    if (!src1Val->GetValueInfo()->HasIntConstantValue() && instr->GetSrc1()->IsRegOpnd())
    {
        StackSym const *sym1 = instr->GetSrc1()->AsRegOpnd()->m_sym;
        if (CurrentBlockData()->IsInt32TypeSpecialized(sym1) == false)
        {
            if (!src2Val->GetValueInfo()->HasIntConstantValue() && instr->GetSrc2()->IsRegOpnd())
            {
                StackSym const *sym2 = instr->GetSrc2()->AsRegOpnd()->m_sym;
                if (CurrentBlockData()->IsInt32TypeSpecialized(sym2) == false)
                {
                    // Type specializing a Br itself isn't worth it, unless one src
                    // is already type specialized
                    return false;
                }
            }
        }
    }
    return true;
}